

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_strglob(char *zGlobPattern,char *zString)

{
  char *zString_local;
  char *zGlobPattern_local;
  
  if (zString == (char *)0x0) {
    zGlobPattern_local._4_4_ = (uint)(zGlobPattern != (char *)0x0);
  }
  else if (zGlobPattern == (char *)0x0) {
    zGlobPattern_local._4_4_ = 1;
  }
  else {
    zGlobPattern_local._4_4_ = patternCompare((u8 *)zGlobPattern,(u8 *)zString,&globInfo,0x5b);
  }
  return zGlobPattern_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_strglob(const char *zGlobPattern, const char *zString){
  if( zString==0 ){
    return zGlobPattern!=0;
  }else if( zGlobPattern==0 ){
    return 1;
  }else {
    return patternCompare((u8*)zGlobPattern, (u8*)zString, &globInfo, '[');
  }
}